

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O1

void __thiscall
ExportEmitString_EscapeQuotes_Test::TestBody(ExportEmitString_EscapeQuotes_Test *this)

{
  string *lhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  char *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  ostringstream os;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  ostream_base *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  ostringstream local_60;
  
  pstore::exchange::export_ns::ostream_base::ostream_base((ostream_base *)(local_70 + 0x10),0x1000);
  local_60.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_00243498;
  local_60.str_._M_dataplus._M_p = (pointer)&local_60.str_.field_2;
  local_60.str_._M_string_length = 0;
  local_60.str_.field_2._M_local_buf[0] = '\0';
  local_70._0_4_ = 0x20222061;
  local_70._4_2_ = 0x62;
  local_78 = 5;
  local_80 = (ostream_base *)local_70;
  pstore::exchange::export_ns::
  emit_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((export_ns *)(local_70 + 0x10),(ostream_base *)local_70,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_70 + 5),in_RCX);
  local_88 = "\"a \\\" b\"";
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                  ((ostringstream *)(local_70 + 0x10));
  testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
            (local_98,"os.str ()","expected",lhs,&local_88);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_emit.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if (local_80 != (ostream_base *)local_70) {
    operator_delete(local_80,CONCAT26(local_70._6_2_,CONCAT24(local_70._4_2_,local_70._0_4_)) + 1);
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)(local_70 + 0x10));
  return;
}

Assistant:

TEST (ExportEmitString, EscapeQuotes) {
    using namespace std::string_literals;

    pstore::exchange::export_ns::ostringstream os;
    auto const str = R"(a " b)"s;
    pstore::exchange::export_ns::emit_string (os, std::begin (str), std::end (str));
    constexpr auto * expected = R"("a \" b")";
    EXPECT_EQ (os.str (), expected);
}